

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.c
# Opt level: O1

ZyanStatus
ZydisStringAppendHexU
          (ZyanString *string,ZyanU64 value,ZyanU8 padding_length,ZyanBool force_leading_number,
          ZyanBool uppercase,ZyanStringView *prefix,ZyanStringView *suffix)

{
  ZyanUSize ZVar1;
  ZyanUSize ZVar2;
  bool bVar3;
  byte bVar4;
  ZyanStatus ZVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  undefined1 *__s;
  byte bVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  
  if (prefix != (ZyanStringView *)0x0) {
    if (string == (ZyanString *)0x0) {
      __assert_fail("destination && source",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0x86,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
    }
    if ((string->vector).allocator != (ZyanAllocator *)0x0) goto LAB_0011e392;
    ZVar1 = (string->vector).size;
    if ((ZVar1 == 0) || (ZVar2 = (prefix->string).vector.size, ZVar2 == 0)) goto LAB_0011e373;
    if ((string->vector).capacity < (ZVar1 + ZVar2) - 1) {
      return 0x80100009;
    }
    memcpy((void *)((long)(string->vector).data + (ZVar1 - 1)),(prefix->string).vector.data,
           ZVar2 - 1);
    ZVar1 = (prefix->string).vector.size;
    ZVar2 = (string->vector).size;
    (string->vector).size = (ZVar1 - 1) + ZVar2;
    *(undefined1 *)((long)(string->vector).data + ZVar1 + ZVar2 + -2) = 0;
  }
  if (string == (ZyanString *)0x0) {
    __assert_fail("string",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/String.c"
                  ,0xed,
                  "ZyanStatus ZydisStringAppendHexU64(ZyanString *, ZyanU64, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  if ((string->vector).allocator != (ZyanAllocator *)0x0) {
    __assert_fail("!string->vector.allocator",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/String.c"
                  ,0xee,
                  "ZyanStatus ZydisStringAppendHexU64(ZyanString *, ZyanU64, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  ZVar1 = (string->vector).size;
  uVar10 = (string->vector).capacity - ZVar1;
  uVar13 = (ulong)padding_length;
  ZVar5 = 0x80100009;
  bVar3 = true;
  if (uVar13 <= uVar10) {
    if (value == 0) {
      bVar4 = 1;
      if (1 < padding_length) {
        bVar4 = padding_length;
      }
      uVar13 = (ulong)bVar4;
      if (uVar13 <= uVar10) {
        memset((void *)((long)(string->vector).data + (ZVar1 - 1)),0x30,uVar13);
        goto LAB_0011e299;
      }
    }
    else {
      pcVar6 = "0123456789ABCDEF";
      if (uppercase == '\0') {
        pcVar6 = "0123456789abcdef";
      }
      lVar14 = (ulong)(value >> 0x20 != 0) * 8 + 7;
      bVar12 = ~(byte)lVar14 + padding_length;
      iVar11 = (int)lVar14 * 4;
      bVar8 = false;
      __s = (undefined1 *)0x0;
      bVar4 = 0;
      do {
        uVar7 = value >> ((byte)iVar11 & 0x3f);
        if (bVar4 == 0) {
          if ((uVar7 & 0xf) == 0) {
            bVar3 = false;
            bVar4 = 0;
          }
          else {
            bVar16 = force_leading_number != '\0';
            bVar15 = 9 < ((byte)uVar7 & 0xf);
            bVar3 = (long)uVar13 <= lVar14;
            uVar9 = (ulong)((uint)((bVar3 && bVar16) && bVar15) + (int)lVar14 & 0xff);
            if (uVar9 < uVar10) {
              __s = (undefined1 *)((long)(string->vector).data + (ZVar1 - 1));
              if ((bVar3 && bVar16) && bVar15) {
                *__s = 0x30;
              }
              bVar4 = (bVar3 && bVar16) && bVar15;
              if (lVar14 < (long)uVar13) {
                memset(__s,0x30,(ulong)bVar12);
                bVar4 = bVar12;
              }
            }
            else {
              bVar4 = 0;
            }
            bVar3 = true;
            if (uVar9 < uVar10) goto LAB_0011e161;
          }
        }
        else {
LAB_0011e161:
          if (__s == (undefined1 *)0x0) {
            __assert_fail("buffer",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/String.c"
                          ,0x124,
                          "ZyanStatus ZydisStringAppendHexU64(ZyanString *, ZyanU64, ZyanU8, ZyanBool, ZyanBool)"
                         );
          }
          __s[bVar4] = pcVar6[(uint)uVar7 & 0xf];
          bVar4 = bVar4 + 1;
          bVar3 = false;
        }
        if (bVar3) break;
        bVar12 = bVar12 + 1;
        iVar11 = iVar11 + -4;
        bVar8 = lVar14 < 1;
        bVar3 = 0 < lVar14;
        lVar14 = lVar14 + -1;
      } while (bVar3);
      ZVar5 = 0x80100009;
      bVar3 = true;
      if (bVar8) {
        uVar13 = (ulong)bVar4;
LAB_0011e299:
        (string->vector).size = ZVar1 + uVar13;
        *(undefined1 *)((long)(string->vector).data + ((ZVar1 + uVar13) - 1)) = 0;
        ZVar5 = 0x100000;
        bVar3 = false;
      }
    }
  }
  if ((!bVar3) && (ZVar5 = 0x100000, suffix != (ZyanStringView *)0x0)) {
    if ((string->vector).allocator != (ZyanAllocator *)0x0) {
LAB_0011e392:
      __assert_fail("!destination->vector.allocator",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0x87,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
    }
    ZVar1 = (string->vector).size;
    if ((ZVar1 == 0) || (ZVar2 = (suffix->string).vector.size, ZVar2 == 0)) {
LAB_0011e373:
      __assert_fail("destination->vector.size && source->string.vector.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0x88,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
    }
    ZVar5 = 0x80100009;
    if ((ZVar1 + ZVar2) - 1 <= (string->vector).capacity) {
      memcpy((void *)((long)(string->vector).data + (ZVar1 - 1)),(suffix->string).vector.data,
             ZVar2 - 1);
      ZVar1 = (suffix->string).vector.size;
      ZVar2 = (string->vector).size;
      (string->vector).size = (ZVar1 + ZVar2) - 1;
      *(undefined1 *)((long)(string->vector).data + ZVar1 + ZVar2 + -2) = 0;
      ZVar5 = 0x100000;
    }
  }
  return ZVar5;
}

Assistant:

ZyanStatus ZydisStringAppendHexU(ZyanString* string, ZyanU64 value, ZyanU8 padding_length,
    ZyanBool force_leading_number, ZyanBool uppercase, const ZyanStringView* prefix,
    const ZyanStringView* suffix)
{
    if (prefix)
    {
        ZYAN_CHECK(ZydisStringAppend(string, prefix));
    }

#if defined(ZYAN_X64) || defined(ZYAN_AARCH64) || defined(ZYAN_PPC64) || defined(ZYAN_RISCV64) || defined(ZYAN_LOONGARCH)
    ZYAN_CHECK(ZydisStringAppendHexU64(string, value, padding_length, force_leading_number,
        uppercase));
#else
    if (value & 0xFFFFFFFF00000000)
    {
        ZYAN_CHECK(ZydisStringAppendHexU64(string, value, padding_length, force_leading_number,
            uppercase));
    }
    else
    {
        ZYAN_CHECK(ZydisStringAppendHexU32(string, (ZyanU32)value, padding_length,
            force_leading_number, uppercase));
    }
#endif

    if (suffix)
    {
        return ZydisStringAppend(string, suffix);
    }
    return ZYAN_STATUS_SUCCESS;
}